

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collector.cpp
# Opt level: O3

ssize_t __thiscall
jaegertracing::thrift::Collector_submitBatches_args::write
          (Collector_submitBatches_args *this,int __fd,void *__buf,size_t __n)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined4 in_register_00000034;
  TProtocol *this_00;
  pointer pBVar6;
  
  this_00 = (TProtocol *)CONCAT44(in_register_00000034,__fd);
  apache::thrift::protocol::TProtocol::incrementOutputRecursionDepth(this_00);
  iVar1 = (*this_00->_vptr_TProtocol[4])(this_00,"Collector_submitBatches_args");
  iVar2 = (*this_00->_vptr_TProtocol[6])(this_00,"batches",0xf,1);
  iVar3 = (*this_00->_vptr_TProtocol[0xb])
                    (this_00,0xc,
                     (ulong)(uint)((int)((ulong)((long)(this->batches).
                                                                                                              
                                                  super__Vector_base<jaegertracing::thrift::Batch,_std::allocator<jaegertracing::thrift::Batch>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                (long)(this->batches).
                                                                                                            
                                                  super__Vector_base<jaegertracing::thrift::Batch,_std::allocator<jaegertracing::thrift::Batch>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                                  -0x3b13b13b));
  iVar3 = iVar2 + iVar1 + iVar3;
  for (pBVar6 = (this->batches).
                super__Vector_base<jaegertracing::thrift::Batch,_std::allocator<jaegertracing::thrift::Batch>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pBVar6 != (this->batches).
                super__Vector_base<jaegertracing::thrift::Batch,_std::allocator<jaegertracing::thrift::Batch>_>
                ._M_impl.super__Vector_impl_data._M_finish; pBVar6 = pBVar6 + 1) {
    iVar1 = (**(code **)(*(long *)pBVar6 + 0x18))(pBVar6,this_00);
    iVar3 = iVar3 + iVar1;
  }
  iVar1 = (*this_00->_vptr_TProtocol[0xc])(this_00);
  iVar2 = (*this_00->_vptr_TProtocol[7])(this_00);
  iVar4 = (*this_00->_vptr_TProtocol[8])(this_00);
  iVar5 = (*this_00->_vptr_TProtocol[5])(this_00);
  this_00->output_recursion_depth_ = this_00->output_recursion_depth_ - 1;
  return (ulong)(uint)(iVar2 + iVar4 + iVar5 + iVar1 + iVar3);
}

Assistant:

uint32_t Collector_submitBatches_args::write(::apache::thrift::protocol::TProtocol* oprot) const {
  uint32_t xfer = 0;
  ::apache::thrift::protocol::TOutputRecursionTracker tracker(*oprot);
  xfer += oprot->writeStructBegin("Collector_submitBatches_args");

  xfer += oprot->writeFieldBegin("batches", ::apache::thrift::protocol::T_LIST, 1);
  {
    xfer += oprot->writeListBegin(::apache::thrift::protocol::T_STRUCT, static_cast<uint32_t>(this->batches.size()));
    std::vector<Batch> ::const_iterator _iter57;
    for (_iter57 = this->batches.begin(); _iter57 != this->batches.end(); ++_iter57)
    {
      xfer += (*_iter57).write(oprot);
    }
    xfer += oprot->writeListEnd();
  }
  xfer += oprot->writeFieldEnd();

  xfer += oprot->writeFieldStop();
  xfer += oprot->writeStructEnd();
  return xfer;
}